

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QColorPicker::setCol(QColorPicker *this,int h,int s)

{
  QPoint QVar1;
  int iVar2;
  long in_FS_OFFSET;
  QRect QVar3;
  QRect QVar4;
  QRect local_48;
  QRect local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (h < 1) {
    h = 0;
  }
  if (0x166 < h) {
    h = 0x167;
  }
  iVar2 = 0;
  if (0 < s) {
    iVar2 = s;
  }
  if (0xfe < iVar2) {
    iVar2 = 0xff;
  }
  if ((h != this->hue) || (iVar2 != this->sat)) {
    local_38._0_8_ = colPt(this);
    local_38.y2.m_i = local_38.y1.m_i + 0x13;
    local_38.x2.m_i = local_38.x1.m_i + 0x13;
    this->hue = h;
    this->sat = iVar2;
    QVar1 = colPt(this);
    local_48.x1.m_i = (int)QVar1.xp.m_i;
    local_48.x2.m_i = local_48.x1.m_i + 0x13;
    local_48.y1.m_i = (int)QVar1.yp.m_i;
    local_48.y2.m_i = local_48.y1.m_i + 0x13;
    local_38 = (QRect)QRect::operator|(&local_38,&local_48);
    QVar3 = QWidget::contentsRect((QWidget *)this);
    QVar4 = QWidget::contentsRect((QWidget *)this);
    local_38.y1.m_i = QVar4.y1.m_i.m_i + -9 + local_38.y1.m_i;
    local_38.x1.m_i = QVar3.x1.m_i.m_i + -9 + local_38.x1.m_i;
    local_38.y2.m_i = QVar4.y1.m_i.m_i + -9 + local_38.y2.m_i;
    local_38.x2.m_i = QVar3.x1.m_i.m_i + -9 + local_38.x2.m_i;
    QWidget::repaint((QWidget *)this,&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorPicker::setCol(int h, int s)
{
    int nhue = qMin(qMax(0,h), 359);
    int nsat = qMin(qMax(0,s), 255);
    if (nhue == hue && nsat == sat)
        return;

    QRect r(colPt(), QSize(20,20));
    hue = nhue; sat = nsat;
    r = r.united(QRect(colPt(), QSize(20,20)));
    r.translate(contentsRect().x()-9, contentsRect().y()-9);
    //    update(r);
    repaint(r);
}